

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O0

PyObject *
boost::python::objects::
class_cref_wrapper<HFParsingInfo,_boost::python::objects::make_instance<HFParsingInfo,_boost::python::objects::value_holder<HFParsingInfo>_>_>
::convert(HFParsingInfo *x)

{
  PyObject *pPVar1;
  HFParsingInfo *in_RDI;
  reference_wrapper<const_HFParsingInfo> *in_stack_00000008;
  undefined1 local_18 [16];
  undefined1 *local_8;
  
  local_8 = local_18;
  addressof<HFParsingInfo_const>(in_RDI);
  pPVar1 = make_instance_impl<HFParsingInfo,boost::python::objects::value_holder<HFParsingInfo>,boost::python::objects::make_instance<HFParsingInfo,boost::python::objects::value_holder<HFParsingInfo>>>
           ::execute<boost::reference_wrapper<HFParsingInfo_const>const>(in_stack_00000008);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }